

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ViewportCallOrderCase::init
          (ViewportCallOrderCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  *this_00;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_01;
  ostringstream *this_02;
  undefined4 uVar1;
  uint uVar2;
  Context *pCVar3;
  RenderContext *renderCtx;
  ShaderProgram *pSVar4;
  undefined8 uVar5;
  ContextInfo *pCVar6;
  TestContext *pTVar7;
  bool bVar8;
  bool bVar9;
  int ndx;
  ContextType ctxType;
  int iVar10;
  deUint32 dVar11;
  undefined4 extraout_var;
  void *__s;
  void *__s_00;
  long lVar12;
  ObjectWrapper *this_03;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  pointer __dest;
  ContextInfo *__dest_00;
  Context *pCVar13;
  TestLog *pTVar14;
  TestError *this_04;
  NotSupportedError *pNVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  value_type_conflict1 *__val;
  float fVar20;
  float fVar21;
  float fVar22;
  size_type __dnew;
  size_type __dnew_1;
  size_type __dnew_3;
  size_type __dnew_2;
  Random rnd;
  undefined1 local_370 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  undefined1 local_348 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  ShaderProgram *local_320;
  Context *local_318;
  TestContext *local_310;
  Context local_308;
  ContextInfo *local_2f0;
  undefined1 local_2e8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  Context local_2a8;
  value_type local_290;
  TestContext *local_270;
  TestContext *local_268;
  value_type local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_1c0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  undefined1 local_100 [208];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar8 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar8) {
    bVar9 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_primitive_bounding_box");
    if (!bVar9) {
      pNVar15 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0._0_8_ = &local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Test requires GL_EXT_primitive_bounding_box extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar15,(string *)local_1b0);
      __cxa_throw(pNVar15,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if (!bVar8) {
      bVar8 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_EXT_tessellation_shader");
      if (!bVar8) {
        pNVar15 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1b0._0_8_ = &local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Test requires GL_EXT_tessellation_shader extension","");
        tcu::NotSupportedError::NotSupportedError(pNVar15,(string *)local_1b0);
        __cxa_throw(pNVar15,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_02 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_02);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_02,
             "Testing call order of state setting functions have no effect on the rendering.\n",0x4f
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_02,"Setting viewport and bounding box in the following order:\n",0x3a);
  bVar8 = this->m_callOrder == VIEWPORT_FIRST;
  pcVar19 = "\tFirst bounding box with glPrimitiveBoundingBoxEXT function.\n";
  if (bVar8) {
    pcVar19 = "\tFirst viewport with glViewport function.\n";
  }
  lVar17 = 0x3d;
  if (bVar8) {
    lVar17 = 0x2a;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_02,pcVar19,lVar17);
  bVar8 = this->m_callOrder == VIEWPORT_FIRST;
  pcVar19 = "\tThen viewport with glViewport function.\n";
  if (bVar8) {
    pcVar19 = "\tThen bounding box with glPrimitiveBoundingBoxEXT function.\n";
  }
  lVar17 = 0x29;
  if (bVar8) {
    lVar17 = 0x3c;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_02,pcVar19,lVar17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_02,"Verifying rendering result.",0x1b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_02);
  std::ios_base::~ios_base(local_138);
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar17 = CONCAT44(extraout_var,iVar10);
  __s = operator_new(0xd80);
  memset(__s,0,0xd80);
  __s_00 = operator_new(0x120);
  memset(__s_00,0,0x120);
  deRandom_init((deRandom *)local_1b0,0x55443322);
  lVar12 = 0;
  do {
    *(int *)((long)__s_00 + lVar12 * 4) = (int)lVar12;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x48);
  uVar18 = 0x48;
  do {
    dVar11 = deRandom_getUint32((deRandom *)local_1b0);
    lVar12 = (long)(int)((ulong)dVar11 % (uVar18 & 0xffffffff));
    uVar1 = *(undefined4 *)((long)__s_00 + uVar18 * 4 + -4);
    *(undefined4 *)((long)__s_00 + uVar18 * 4 + -4) = *(undefined4 *)((long)__s_00 + lVar12 * 4);
    *(undefined4 *)((long)__s_00 + lVar12 * 4) = uVar1;
    uVar18 = uVar18 - 1;
  } while (1 < uVar18);
  lVar12 = (long)__s + 0x2c;
  lVar16 = 0;
  do {
    uVar2 = *(uint *)((long)__s_00 + lVar16 * 4);
    iVar10 = (int)uVar2 / 0xc;
    fVar20 = (float)(((int)uVar2 / 2) % 6) / 6.0;
    fVar22 = (float)iVar10 / 6.0 + (float)iVar10 / 6.0 + -1.0;
    *(float *)(lVar12 + -0x2c) = fVar20;
    *(float *)(lVar12 + -0x28) = fVar22;
    *(undefined8 *)(lVar12 + -0x24) = 0x3f80000000000000;
    fVar21 = (float)(((int)uVar2 / 2) % 6 + 1) / 6.0;
    if ((uVar2 & 1) == 0) {
      fVar22 = (float)(iVar10 + 1) / 6.0;
      fVar22 = fVar22 + fVar22 + -1.0;
      *(float *)(lVar12 + -0x1c) = fVar21;
      *(float *)(lVar12 + -0x18) = fVar22;
      *(undefined8 *)(lVar12 + -0x14) = 0x3f80000000000000;
      fVar21 = fVar20;
    }
    else {
      *(float *)(lVar12 + -0x1c) = fVar21;
      *(float *)(lVar12 + -0x18) = fVar22;
      *(undefined8 *)(lVar12 + -0x14) = 0x3f80000000000000;
      fVar20 = (float)(iVar10 + 1) / 6.0;
      fVar22 = fVar20 + fVar20 + -1.0;
    }
    *(float *)(lVar12 + -0xc) = fVar21;
    *(float *)(lVar12 + -8) = fVar22;
    *(undefined8 *)(lVar12 + -4) = 0x3f80000000000000;
    lVar16 = lVar16 + 1;
    lVar12 = lVar12 + 0x30;
  } while (lVar16 != 0x48);
  this_03 = (ObjectWrapper *)operator_new(0x18);
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(this_03,(Functions *)CONCAT44(extraout_var_00,iVar10),traits);
  local_370._0_8_ = (TypedObjectWrapper<(glu::ObjectType)1> *)0x0;
  this_00 = &this->m_vbo;
  if (&((this->m_vbo).
        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
        .m_data.ptr)->super_ObjectWrapper != this_03) {
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::reset(&this_00->
             super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
           );
    (this_00->
    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)this_03;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
           *)local_370);
  (**(code **)(lVar17 + 0x40))
            (0x8892,(((this_00->
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                      ).m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar17 + 0x150))(0x8892,0xd80,__s,0x88e4);
  dVar11 = (**(code **)(lVar17 + 0x800))();
  pcVar19 = (char *)0x12cd;
  glu::checkError(dVar11,"create vbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x12cd);
  this->m_numVertices = 0xd8;
  operator_delete(__s_00,0x120);
  operator_delete(__s,0xd80);
  local_320 = (ShaderProgram *)operator_new(0xd0);
  pCVar3 = (this->super_TestCase).m_context;
  renderCtx = pCVar3->m_renderCtx;
  local_100[0x10] = 0;
  local_100._17_8_ = 0;
  local_100._0_8_ = (pointer)0x0;
  local_100[8] = 0;
  local_100._9_7_ = 0;
  memset(local_1b0,0,0xac);
  local_2e8._16_8_ = local_2e8 + 0x20;
  local_348._0_8_ = (pointer)0x102;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)(local_2e8 + 0x10),(ulong)local_348);
  uVar5 = local_348._0_8_;
  local_2e8._32_8_ = local_348._0_8_;
  local_2e8._16_8_ = __dest;
  memcpy(__dest,
         "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_vertex_color;\nvoid main()\n{\n\tgl_Position = a_position;\n\t// yellowish shade\n\thighp float redComponent = 0.5 + float(gl_VertexID % 5) / 8.0;\n\tv_vertex_color = vec4(redComponent, 1.0, 0.0, 1.0);\n}\n"
         ,0x102);
  local_2e8._24_8_ = uVar5;
  *(char *)((long)&(__dest->_M_dataplus)._M_p + uVar5) = '\0';
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1e0,(_anonymous_namespace_ *)pCVar3,(Context *)local_2e8._16_8_,pcVar19);
  local_370._0_8_ = local_370._0_8_ & 0xffffffff00000000;
  local_370._8_8_ = local_360._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_370 + 8),local_1e0._M_dataplus._M_p,
             local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_370._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_370 + 8));
  pCVar3 = (this->super_TestCase).m_context;
  local_308.m_contextInfo = (ContextInfo *)local_2e8;
  local_2a8.m_contextInfo = (ContextInfo *)0x81;
  __dest_00 = (ContextInfo *)
              std::__cxx11::string::_M_create
                        ((ulong *)&local_308.m_contextInfo,(ulong)&local_2a8.m_contextInfo);
  pCVar6 = local_2a8.m_contextInfo;
  local_2e8._0_8_ = local_2a8.m_contextInfo;
  local_308.m_contextInfo = __dest_00;
  memcpy(__dest_00,
         "${GLSL_VERSION_DECL}\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
         ,0x81);
  local_2f0 = pCVar6;
  *(undefined1 *)((long)&__dest_00->_vptr_ContextInfo + (long)pCVar6) = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_200,(_anonymous_namespace_ *)pCVar3,(Context *)local_308.m_contextInfo,pcVar19);
  local_348._0_4_ = 1;
  local_348._8_8_ = local_338._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_348 + 8),local_200._M_dataplus._M_p,
             local_200._M_dataplus._M_p + local_200._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_348._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_348 + 8));
  pCVar3 = (this->super_TestCase).m_context;
  local_318 = &local_308;
  local_268 = (TestContext *)0x1a6;
  pCVar13 = (Context *)std::__cxx11::string::_M_create((ulong *)&local_318,(ulong)&local_268);
  pTVar7 = local_268;
  local_308.m_testCtx = local_268;
  local_318 = pCVar13;
  memcpy(pCVar13,
         "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices=3) out;\nin highp vec4 v_vertex_color[];\nout highp vec4 v_tess_eval_color[];\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\tv_tess_eval_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n\tgl_TessLevelOuter[0] = 2.8;\n\tgl_TessLevelOuter[1] = 2.8;\n\tgl_TessLevelOuter[2] = 2.8;\n\tgl_TessLevelInner[0] = 2.8;\n}\n"
         ,0x1a6);
  local_310 = pTVar7;
  *(undefined1 *)((long)&pCVar13->m_testCtx + (long)pTVar7) = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_220,(_anonymous_namespace_ *)pCVar3,local_318,pcVar19);
  local_2a8.m_contextInfo = (ContextInfo *)CONCAT44(local_2a8.m_contextInfo._4_4_,3);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,local_220._M_dataplus._M_p,
             local_220._M_dataplus._M_p + local_220._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + ((ulong)local_2a8.m_contextInfo & 0xffffffff) * 0x18),&local_290);
  pCVar3 = (this->super_TestCase).m_context;
  local_270 = (TestContext *)0x1f5;
  local_2b8._M_allocated_capacity = (size_type)&local_2a8;
  pCVar13 = (Context *)
            std::__cxx11::string::_M_create(&local_2b8._M_allocated_capacity,(ulong)&local_270);
  pTVar7 = local_270;
  local_2a8.m_testCtx = local_270;
  local_2b8._M_allocated_capacity = (size_type)pCVar13;
  memcpy(pCVar13,
         "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\nin highp vec4 v_tess_eval_color[];\nout highp vec4 v_color;\nprecise gl_Position;\nvoid main()\n{\n\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n\t            + gl_TessCoord.y * gl_in[1].gl_Position\n\t            + gl_TessCoord.z * gl_in[2].gl_Position;\n\tv_color = gl_TessCoord.x * v_tess_eval_color[0]\n\t        + gl_TessCoord.y * v_tess_eval_color[1]\n\t        + gl_TessCoord.z * v_tess_eval_color[2];\n}\n"
         ,0x1f5);
  local_2b8._8_8_ = pTVar7;
  *(undefined1 *)((long)&pCVar13->m_testCtx + (long)pTVar7) = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_240,(_anonymous_namespace_ *)pCVar3,(Context *)local_2b8._M_allocated_capacity,
             pcVar19);
  local_268 = (TestContext *)CONCAT44(local_268._4_4_,4);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,local_240._M_dataplus._M_p,
             local_240._M_dataplus._M_p + local_240._M_string_length);
  pSVar4 = local_320;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + ((ulong)local_268 & 0xffffffff) * 0x18),&local_260);
  glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,(ProgramSources *)local_1b0);
  local_1c0.m_data.ptr = (ShaderProgram *)0x0;
  this_01 = &this->m_program;
  if ((this->m_program).
      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
      pSVar4) {
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&this_01->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
    (this_01->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data.
    ptr = pSVar4;
  }
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((Context *)local_2b8._M_allocated_capacity != &local_2a8) {
    operator_delete((void *)local_2b8._M_allocated_capacity,
                    (ulong)((long)&(local_2a8.m_testCtx)->m_platform + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,(ulong)((long)&(local_308.m_testCtx)->m_platform + 1));
  }
  if ((char *)local_348._8_8_ != local_338._M_local_buf + 8) {
    operator_delete((void *)local_348._8_8_,
                    CONCAT17(local_338._M_local_buf[0xf],
                             CONCAT16(local_338._M_local_buf[0xe],local_338._8_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_308.m_contextInfo != (ContextInfo *)local_2e8) {
    operator_delete(local_308.m_contextInfo,(ulong)((long)(_func_int ***)local_2e8._0_8_ + 1));
  }
  if ((char *)local_370._8_8_ != local_360._M_local_buf + 8) {
    operator_delete((void *)local_370._8_8_,local_360._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_2e8._16_8_ != (pointer)(local_2e8 + 0x20)) {
    operator_delete((void *)local_2e8._16_8_,
                    (ulong)((long)&((_Alloc_hider *)local_2e8._32_8_)->_M_p + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_120);
  lVar17 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + lVar17));
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  pTVar14 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_360._M_allocated_capacity._0_4_ = 0x676f7250;
  local_370._8_8_ = 7;
  local_360._M_allocated_capacity._4_4_ = 0x6d6172;
  local_338._M_allocated_capacity._0_6_ = 0x726564616853;
  local_338._M_allocated_capacity._6_2_ = 0x7020;
  local_338._8_6_ = 0x6d6172676f72;
  local_348._8_8_ = 0xe;
  local_338._M_local_buf[0xe] = '\0';
  local_370._0_8_ = &local_360;
  local_348._0_8_ = &local_338;
  tcu::LogSection::LogSection((LogSection *)local_1b0,(string *)local_370,(string *)local_348);
  tcu::TestLog::startSection(pTVar14,(char *)local_1b0._0_8_,local_190._M_p);
  pTVar14 = glu::operator<<(pTVar14,(this_01->
                                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                    ).m_data.ptr);
  tcu::TestLog::endSection(pTVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,(ulong)(local_180[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._0_8_ != &local_338) {
    operator_delete((void *)local_348._0_8_,
                    CONCAT26(local_338._M_allocated_capacity._6_2_,
                             local_338._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._0_8_ != &local_360) {
    operator_delete((void *)local_370._0_8_,
                    CONCAT44(local_360._M_allocated_capacity._4_4_,
                             local_360._M_allocated_capacity._0_4_) + 1);
  }
  pSVar4 = (this_01->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
           m_data.ptr;
  if ((pSVar4->m_program).m_info.linkOk != false) {
    return (int)pSVar4;
  }
  this_04 = (TestError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"shader build failed","");
  tcu::TestError::TestError(this_04,(string *)local_1b0);
  __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ViewportCallOrderCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing call order of state setting functions have no effect on the rendering.\n"
		<< "Setting viewport and bounding box in the following order:\n"
			<< ((m_callOrder == VIEWPORT_FIRST)
				? ("\tFirst viewport with glViewport function.\n")
				: ("\tFirst bounding box with glPrimitiveBoundingBoxEXT function.\n"))
			<< ((m_callOrder == VIEWPORT_FIRST)
				? ("\tThen bounding box with glPrimitiveBoundingBoxEXT function.\n")
				: ("\tThen viewport with glViewport function.\n"))
		<< "Verifying rendering result."
		<< tcu::TestLog::EndMessage;

	// resources
	genVbo();
	genProgram();
}